

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic.c
# Opt level: O2

uint32_t nn_atomic_inc(nn_atomic *self,uint32_t n)

{
  uint32_t uVar1;
  
  LOCK();
  uVar1 = self->n;
  self->n = self->n + n;
  UNLOCK();
  return uVar1;
}

Assistant:

uint32_t nn_atomic_inc (struct nn_atomic *self, uint32_t n)
{
#if defined NN_ATOMIC_WINAPI
    return (uint32_t) InterlockedExchangeAdd ((LONG*) &self->n, n);
#elif defined NN_ATOMIC_SOLARIS
    return atomic_add_32_nv (&self->n, n) - n;
#elif defined NN_ATOMIC_GCC_BUILTINS
    return (uint32_t) __sync_fetch_and_add (&self->n, n);
#elif defined NN_ATOMIC_MUTEX
    uint32_t res;
    nn_mutex_lock (&self->sync);
    res = self->n;
    self->n += n;
    nn_mutex_unlock (&self->sync);
    return res;
#else
#error
#endif
}